

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<32U,_4U,_buffer_layout_dfs>::operator()
          (fill<32U,_4U,_buffer_layout_dfs> *this,array<Stream,_32UL> *streams,uchar **buffer,
          array<unsigned_long,_32UL> *buffer_count)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  int iVar5;
  ostream *poVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  uchar **ppuVar10;
  long lVar11;
  size_t sVar12;
  size_t n0;
  fill<32U,_8U,_buffer_layout_dfs> local_5c;
  fill<32U,_9U,_buffer_layout_dfs> local_5b;
  fill<32U,_9U,_buffer_layout_dfs> local_5a;
  fill<32U,_8U,_buffer_layout_dfs> local_59;
  uchar **local_58;
  array<Stream,_32UL> *local_50;
  uchar **local_48;
  DI __d;
  
  local_50 = streams;
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"fill_inner");
  poVar6 = std::operator<<(poVar6,", inner, I=");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 8;
  puVar2 = buffer_count->_M_elems + 9;
  local_48 = buffer + 0x1f;
  local_58 = buffer + 8;
  n0 = 0;
  lVar11 = 0;
  do {
    uVar8 = *puVar1;
    if (uVar8 == 0) {
      fill<32U,_8U,_buffer_layout_dfs>::operator()(&local_59,local_50,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"left stream drained\n");
        sVar12 = -lVar11;
        lVar11 = -n0;
        uVar8 = *puVar2;
        goto LAB_00190297;
      }
    }
    uVar9 = *puVar2;
    if (uVar9 == 0) {
      fill<32U,_9U,_buffer_layout_dfs>::operator()(&local_5a,local_50,buffer,buffer_count);
      uVar9 = *puVar2;
      if (uVar9 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"right stream drained\n");
        sVar12 = -lVar11;
        lVar11 = -n0;
        uVar8 = *puVar1;
        goto LAB_00190360;
      }
      uVar8 = *puVar1;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,"L:\'");
    ppuVar10 = local_48 + (0xb6 - uVar8);
    poVar6 = std::operator<<(poVar6,(char *)*ppuVar10);
    poVar6 = std::operator<<(poVar6,"\', R:\'");
    ppuVar4 = buffer + (0x19b - uVar9);
    poVar6 = std::operator<<(poVar6,(char *)*ppuVar4);
    std::operator<<(poVar6,"\'\n");
    iVar5 = cmp(*ppuVar10,*ppuVar4);
    puVar7 = puVar2;
    if (iVar5 < 1) {
      puVar7 = puVar1;
      ppuVar4 = ppuVar10;
    }
    puVar3 = *ppuVar4;
    *puVar7 = *puVar7 - 1;
    buffer[n0 + 8] = puVar3;
    check_input(local_58,n0);
    lVar11 = lVar11 + -8;
    n0 = n0 + 1;
  } while (n0 != 0x17);
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar6,"Done, buffer filled\n");
  buffer_count->_M_elems[4] = 0x17;
  goto LAB_001904ab;
LAB_00190297:
  do {
    if (uVar8 == 0) {
      fill<32U,_9U,_buffer_layout_dfs>::operator()(&local_5b,local_50,buffer,buffer_count);
      uVar8 = *puVar2;
      if (uVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"both streams prematurely drained\n");
        ppuVar10 = (uchar **)((long)local_48 - sVar12);
        memmove(buffer + lVar11 + 0x1f,local_58,sVar12);
        buffer_count->_M_elems[4] = -lVar11;
        check_input(ppuVar10,-lVar11);
        goto LAB_001904ab;
      }
    }
    *(uchar **)((long)buffer + sVar12 + 0x40) = buffer[0x19b - uVar8];
    uVar8 = uVar8 - 1;
    *puVar2 = uVar8;
    lVar11 = lVar11 + -1;
    sVar12 = sVar12 + 8;
  } while (sVar12 != 0xb8);
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar6,"\tbuffer filled\n");
  buffer_count->_M_elems[4] = 0x17;
  check_input(local_58,0x17);
  goto LAB_001904ab;
LAB_00190360:
  do {
    if (uVar8 == 0) {
      fill<32U,_8U,_buffer_layout_dfs>::operator()(&local_5c,local_50,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"both streams prematurely drained\n");
        ppuVar10 = (uchar **)((long)local_48 - sVar12);
        memmove(local_48 + lVar11,local_58,sVar12);
        buffer_count->_M_elems[4] = -lVar11;
        check_input(ppuVar10,-lVar11);
        goto LAB_001904ab;
      }
    }
    *(uchar **)((long)buffer + sVar12 + 0x40) = buffer[0xd5 - uVar8];
    uVar8 = uVar8 - 1;
    *puVar1 = uVar8;
    lVar11 = lVar11 + -1;
    sVar12 = sVar12 + 8;
  } while (sVar12 != 0xb8);
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar6,"buffer filled\n");
  buffer_count->_M_elems[4] = 0x17;
  check_input(local_58,0x17);
LAB_001904ab:
  anon_func::DI::~DI(&__d);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}